

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionPair.h
# Opt level: O3

void __thiscall
chrono::collision::ChCollisionPair::Set
          (ChCollisionPair *this,ChGeometry *mgeo1,ChGeometry *mgeo2,ChVector<double> *mp1,
          ChVector<double> *mp2,ChVector<float> *mnormal,float *mreaction_cache)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 in_XMM3_Qa;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  this->geo1 = mgeo1;
  this->geo2 = mgeo2;
  if (&this->p1 != mp1) {
    (this->p1).m_data[0] = mp1->m_data[0];
    (this->p1).m_data[1] = mp1->m_data[1];
    (this->p1).m_data[2] = mp1->m_data[2];
  }
  if (&this->p2 != mp2) {
    (this->p2).m_data[0] = mp2->m_data[0];
    (this->p2).m_data[1] = mp2->m_data[1];
    (this->p2).m_data[2] = mp2->m_data[2];
  }
  if (&this->normal == mnormal) {
    fVar1 = mnormal->m_data[2];
  }
  else {
    (this->normal).m_data[0] = mnormal->m_data[0];
    (this->normal).m_data[1] = mnormal->m_data[1];
    fVar1 = mnormal->m_data[2];
    (this->normal).m_data[2] = fVar1;
  }
  this->just_intersection = false;
  this->reactions_cache = mreaction_cache;
  auVar6._0_8_ = (double)mnormal->m_data[0];
  auVar6._8_8_ = in_XMM3_Qa;
  auVar2._0_8_ = (double)fVar1;
  auVar2._8_8_ = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = mp2->m_data[0] - mp1->m_data[0];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (mp2->m_data[1] - mp1->m_data[1]) * (double)mnormal->m_data[1];
  auVar3 = vfmadd231sd_fma(auVar4,auVar3,auVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = mp2->m_data[2] - mp1->m_data[2];
  auVar3 = vfmadd213sd_fma(auVar2,auVar5,auVar3);
  this->norm_dist = (double)(float)auVar3._0_8_;
  return;
}

Assistant:

void Set(geometry::ChGeometry* mgeo1,
             geometry::ChGeometry* mgeo2,
             const ChVector<>& mp1,
             const ChVector<>& mp2,
             const ChVector<float>& mnormal,
             float* mreaction_cache = 0) {
        geo1 = mgeo1;
        geo2 = mgeo2;
        p1 = mp1;
        p2 = mp2;
        normal = mnormal;
        just_intersection = false;
        reactions_cache = mreaction_cache;

        norm_dist = Vdot(mnormal, mp2 - mp1);
    }